

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_parser_exception.cpp
# Opt level: O2

void __thiscall
argo::json_parser_exception::json_parser_exception
          (json_parser_exception *this,exception_type et,string *s,size_t byte_index)

{
  char *pcVar1;
  
  json_exception::json_exception(&this->super_json_exception,et);
  *(undefined ***)&this->super_json_exception = &PTR__exception_00126c48;
  this->m_byte_index = byte_index;
  pcVar1 = get_main_message(this);
  snprintf((this->super_json_exception).m_message,200,
           "parser exception, %s, at or near byte %zu : %s",pcVar1,byte_index,(s->_M_dataplus)._M_p)
  ;
  return;
}

Assistant:

json_parser_exception::json_parser_exception(exception_type et, const string &s, size_t byte_index) noexcept:
                    json_exception(et),
                    m_byte_index(byte_index)
{
    snprintf(m_message, max_message_length, "parser exception, %s, at or near byte %zu : %s", get_main_message(), m_byte_index, s.c_str());
}